

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_precedence(gravity_parser_t *parser,prec_level precedence)

{
  gravity_lexer_t *lexer;
  parse_func p_Var1;
  gtoken_s token;
  gtoken_t gVar2;
  uint uVar3;
  gnode_t *pgVar4;
  char *pcVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  char *local_60;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gVar2 = gravity_lexer_peek(lexer);
  if (gVar2 == TOK_EOF) {
    pgVar4 = (gnode_t *)0x0;
  }
  else {
    p_Var1 = rules[gVar2].prefix;
    if (p_Var1 == (parse_func)0x0) {
      pgVar4 = (gnode_t *)0x0;
    }
    else {
      uVar3 = parser->expr_depth + 1;
      parser->expr_depth = uVar3;
      if (0x200 < uVar3) {
        gravity_lexer_next(lexer);
        gravity_lexer_token(lexer);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x141949);
        return (gnode_t *)0x0;
      }
      pgVar4 = (*p_Var1)(parser);
    }
    if (p_Var1 != (parse_func)0x0) {
      parser->expr_depth = parser->expr_depth - 1;
    }
    if (p_Var1 == (parse_func)0x0 || pgVar4 == (gnode_t *)0x0) {
      gravity_lexer_next(lexer);
      gravity_lexer_token(lexer);
      pcVar5 = token_name(gVar2);
      pgVar4 = (gnode_t *)0x0;
      token.lineno = uStack_7c;
      token.type = local_80;
      token.colno = uStack_78;
      token.position = uStack_74;
      token.bytes = local_70;
      token.length = uStack_6c;
      token.fileid = uStack_68;
      token.builtin = uStack_64;
      token.value = local_60;
      report_error(parser,GRAVITY_ERROR_SYNTAX,token,"Expected expression but found %s.",pcVar5,
                   in_R8,in_R9);
    }
    else {
      gVar2 = gravity_lexer_peek(lexer);
      while ((gVar2 != TOK_EOF && (precedence < rules[gVar2].precedence))) {
        gVar2 = gravity_lexer_next(lexer);
        parser->current_token = gVar2;
        parser->current_node = pgVar4;
        pgVar4 = (*rules[gVar2].infix)(parser);
        gVar2 = gravity_lexer_peek(lexer);
      }
    }
  }
  return pgVar4;
}

Assistant:

static gnode_t *parse_precedence(gravity_parser_t *parser, prec_level precedence) {
    DEBUG_PARSER("parse_precedence (level %d)", precedence);
    DECLARE_LEXER;

    // peek next and check for EOF
    gtoken_t type = gravity_lexer_peek(lexer);
    if (type == TOK_EOF) return NULL;

    // execute prefix callback (if any)
    parse_func prefix = rules[type].prefix;

    // to protect stack from excessive recursion
    if (prefix && (++parser->expr_depth > MAX_EXPRESSION_DEPTH)) {
        // consume next token to avoid infinite loops
        gravity_lexer_next(lexer);
        REPORT_ERROR(gravity_lexer_token(lexer), "Maximum expression depth reached.");
        return NULL;
    }
    gnode_t *node = (prefix) ? prefix(parser) : NULL;
    if (prefix) --parser->expr_depth;

    if (!prefix || !node) {
        // we need to consume next token because error was triggered in peek
        gravity_lexer_next(lexer);
        REPORT_ERROR(gravity_lexer_token(lexer), "Expected expression but found %s.", token_name(type));
        return NULL;
    }

    // peek next and check for EOF
    gtoken_t peek = gravity_lexer_peek(lexer);
    if (peek == TOK_EOF) return node;

    while (precedence < rules[peek].precedence) {
        gtoken_t tok = gravity_lexer_next(lexer);
        grammar_rule *rule = &rules[tok];

        // execute infix callback
        parser->current_token = tok;
        parser->current_node = node;
        node = rule->infix(parser);

        // peek next and check for EOF
        peek = gravity_lexer_peek(lexer);
        if (peek == TOK_EOF) break;
    }

    return node;
}